

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

double FindLocalLayerHeight
                 (vector<vector3,_std::allocator<vector3>_> *existing_layer,vector3 *test_vertex,
                 bool is_first_layer)

{
  pointer pvVar1;
  long lVar2;
  double *pdVar3;
  undefined7 in_register_00000011;
  bool bVar4;
  double dVar5;
  double in_XMM3_Qa;
  double dVar6;
  double dVar7;
  
  if ((int)CONCAT71(in_register_00000011,is_first_layer) != 0) {
    return test_vertex->z;
  }
  pvVar1 = (existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)(existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  pdVar3 = &pvVar1->z;
  dVar5 = 1000.0;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    dVar6 = test_vertex->x - ((vector3 *)(pdVar3 + -2))->x;
    dVar7 = test_vertex->y - pdVar3[-1];
    dVar6 = SQRT(dVar6 * dVar6 + dVar7 * dVar7);
    in_XMM3_Qa = (double)(~-(ulong)(dVar6 < dVar5) & (ulong)in_XMM3_Qa |
                         (ulong)*pdVar3 & -(ulong)(dVar6 < dVar5));
    if (dVar5 <= dVar6) {
      dVar6 = dVar5;
    }
    dVar5 = dVar6;
    pdVar3 = pdVar3 + 3;
  }
  return test_vertex->z - in_XMM3_Qa;
}

Assistant:

double FindLocalLayerHeight(std::vector<vector3> *existing_layer, vector3 &test_vertex, bool is_first_layer)
{
  if (is_first_layer)
  {
    return test_vertex.z;
  }

  vector3 temp_vertex, nearest_vertex;
  double minimun_distance = 1000, temp_distance;
  for (int i = 0; i < existing_layer->size(); i++)
  {
    temp_vertex = (*existing_layer)[i];
    temp_distance = (test_vertex - temp_vertex).XYLength();
    if (temp_distance < minimun_distance)
    {
      minimun_distance = temp_distance;
      nearest_vertex = temp_vertex;
    }
  }

  return test_vertex.z - nearest_vertex.z;
}